

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool array_container_is_subset_run(array_container_t *container1,run_container_t *container2)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  int32_t n_runs;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  _Bool _Var12;
  
  iVar3 = container1->cardinality;
  uVar5 = croaring_hardware_support();
  if ((uVar5 & 2) == 0) {
    uVar5 = croaring_hardware_support();
    if ((uVar5 & 1) == 0) {
      iVar8 = container2->n_runs;
      lVar6 = (long)iVar8;
      if (0 < lVar6) {
        lVar10 = 0;
        do {
          iVar8 = iVar8 + (uint)container2->runs[lVar10].length;
          lVar10 = lVar10 + 1;
        } while (lVar6 != lVar10);
      }
    }
    else {
      iVar8 = _avx2_run_container_cardinality(container2);
    }
  }
  else {
    iVar8 = _avx512_run_container_cardinality(container2);
  }
  _Var12 = false;
  uVar5 = 0;
  if (iVar3 <= iVar8) {
    uVar4 = container1->cardinality;
    if (0 < (int)uVar4) {
      uVar7 = 0;
      uVar9 = 0;
      do {
        uVar5 = (uint)uVar7;
        if (container2->n_runs <= (int)uVar9) break;
        uVar1 = container2->runs[uVar9].value;
        uVar2 = container1->array[uVar7];
        if (uVar2 < uVar1) {
          return false;
        }
        uVar11 = (uint)container2->runs[uVar9].length + (uint)uVar1;
        uVar9 = uVar9 + (uVar11 < uVar2);
        uVar5 = (uVar5 + 1) - (uint)(uVar11 < uVar2);
        uVar7 = (ulong)uVar5;
      } while ((int)uVar5 < (int)uVar4);
    }
    _Var12 = uVar5 == uVar4;
  }
  return _Var12;
}

Assistant:

bool array_container_is_subset_run(const array_container_t* container1,
                                   const run_container_t* container2) {
    if (container1->cardinality > run_container_cardinality(container2))
        return false;
    int i_array = 0, i_run = 0;
    while (i_array < container1->cardinality && i_run < container2->n_runs) {
        uint32_t start = container2->runs[i_run].value;
        uint32_t stop = start + container2->runs[i_run].length;
        if (container1->array[i_array] < start) {
            return false;
        } else if (container1->array[i_array] > stop) {
            i_run++;
        } else {  // the value of the array is in the run
            i_array++;
        }
    }
    if (i_array == container1->cardinality) {
        return true;
    } else {
        return false;
    }
}